

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_geometry_device.cpp
# Opt level: O3

void device_init(char *cfg)

{
  RTCScene scene;
  LazyGeometry *pLVar1;
  int i;
  long lVar2;
  undefined8 *puVar3;
  float fVar4;
  float fVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_38;
  
  embree::g_scene = (RTCScene)rtcNewScene(g_device);
  embree::createGroundPlane(embree::g_scene);
  puVar3 = &embree::g_objects;
  lVar2 = 0;
  do {
    scene = embree::g_scene;
    fVar4 = (float)(int)lVar2 * 6.2831855 * 0.015625;
    fVar5 = cosf(fVar4);
    fVar4 = sinf(fVar4);
    local_38.m128[0] = fVar5 * 10.0;
    local_38.m128[1] = 0.0;
    local_38.m128[2] = fVar4 * 10.0;
    local_38.m128[3] = 0.0;
    pLVar1 = embree::createLazyObject(scene,(int)lVar2,(Vec3fa *)&local_38.field_1,1.0);
    *puVar3 = pLVar1;
    lVar2 = lVar2 + 1;
    puVar3 = puVar3 + 1;
  } while (lVar2 != 0x40);
  rtcCommitScene(embree::g_scene);
  return;
}

Assistant:

void device_init (char* cfg)
{
  /* create scene */
  g_scene = rtcNewScene(g_device);
  
  /* instantiate geometry */
  createGroundPlane(g_scene);
  for (int i=0; i<numSpheres; i++) {
    float a = 2.0f*float(M_PI)*(float)i/(float)numSpheres;
    g_objects[i] = createLazyObject(g_scene,i,10.0f*Vec3fa(cosf(a),0,sinf(a)),1);
  }
  rtcCommitScene (g_scene);
}